

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_longname(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = read_body_to_string(a,(tar *)&tar->longname,(archive_string *)h,unconsumed,unconsumed);
  if (wVar1 == L'\0') {
    wVar1 = tar_read_header(a,tar,entry,unconsumed);
    if ((wVar1 == L'\0') || (wVar1 == L'\xffffffec')) {
      wVar2 = _archive_entry_copy_pathname_l
                        (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
      if (wVar2 != L'\0') {
        wVar1 = set_conversion_failed_error(a,tar->sconv,"Pathname");
        return wVar1;
      }
    }
  }
  return wVar1;
}

Assistant:

static int
header_longname(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	err = read_body_to_string(a, tar, &(tar->longname), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);
	/* Read and parse "real" header, then override name. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);
	if (archive_entry_copy_pathname_l(entry, tar->longname.s,
	    archive_strlen(&(tar->longname)), tar->sconv) != 0)
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
	return (err);
}